

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O2

void callhook(lua_State *L,int event,BCLine line)

{
  code *pcVar1;
  byte bVar2;
  ulong uVar3;
  lua_Debug ar;
  
  uVar3 = (ulong)(L->glref).ptr32;
  pcVar1 = *(code **)(uVar3 + 0x168);
  if ((pcVar1 != (code *)0x0) && (bVar2 = *(byte *)(uVar3 + 0x109), (bVar2 & 0x10) == 0)) {
    *(byte *)(uVar3 + 0x31c) = *(byte *)(uVar3 + 0x31c) & 0xef;
    ar.i_ci = (int)((long)L->base + (-8 - (ulong)(L->stack).ptr32) >> 3);
    ar.event = event;
    ar.currentline = line;
    if ((long)((ulong)(L->maxstack).ptr32 - (long)L->top) < 0xa9) {
      lj_state_growstack(L,0x15);
      bVar2 = *(byte *)(uVar3 + 0x109);
    }
    *(byte *)(uVar3 + 0x109) = bVar2 | 0x10;
    (*pcVar1)(L,&ar);
    *(int *)(uVar3 + 0x188) = (int)L;
    *(byte *)(uVar3 + 0x109) = *(byte *)(uVar3 + 0x109) & 0xef;
  }
  return;
}

Assistant:

static void callhook(lua_State *L, int event, BCLine line)
{
  global_State *g = G(L);
  lua_Hook hookf = g->hookf;
  if (hookf && !hook_active(g)) {
    lua_Debug ar;
    lj_trace_abort(g);  /* Abort recording on any hook call. */
    ar.event = event;
    ar.currentline = line;
    /* Top frame, nextframe = NULL. */
    ar.i_ci = (int)((L->base-1) - tvref(L->stack));
    lj_state_checkstack(L, 1+LUA_MINSTACK);
#if LJ_HASPROFILE && !LJ_PROFILE_SIGPROF
    lj_profile_hook_enter(g);
#else
    hook_enter(g);
#endif
    hookf(L, &ar);
    lj_assertG(hook_active(g), "active hook flag removed");
    setgcref(g->cur_L, obj2gco(L));
#if LJ_HASPROFILE && !LJ_PROFILE_SIGPROF
    lj_profile_hook_leave(g);
#else
    hook_leave(g);
#endif
  }
}